

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

string * __thiscall
ctemplate::TemplateToken::ToString_abi_cxx11_(string *__return_storage_ptr__,TemplateToken *this)

{
  char *pcVar1;
  size_t sVar2;
  ModifierInfo *__rhs;
  pointer pMVar3;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = this->text;
  sVar2 = this->textlen;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  for (pMVar3 = (this->modvals).
                super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar3 != (this->modvals).
                super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                ._M_impl.super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
    __rhs = pMVar3->modifier_info;
    std::__cxx11::string::string((string *)&local_70,":",&local_71);
    std::operator+(&local_50,&local_70,&__rhs->long_name);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (pMVar3->modifier_info->is_registered == false) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {   // used for debugging (annotations)
    string retval(text, textlen);
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end();  ++it) {
      const string& modname = it->modifier_info->long_name;
      retval += string(":") + modname;
      if (!it->modifier_info->is_registered)
        retval += "<not registered>";
    }
    return retval;
  }